

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Item.hpp
# Opt level: O0

void __thiscall Item::~Item(Item *this)

{
  Item *this_local;
  
  (this->super_GreenCard).super_Card._vptr_Card = (_func_int **)&PTR_effectBonus_0012b288;
  std::__cxx11::string::~string((string *)&this->cardText);
  std::__cxx11::string::~string((string *)&this->name);
  GreenCard::~GreenCard(&this->super_GreenCard);
  return;
}

Assistant:

virtual ~Item() {}